

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

string * __thiscall
kratos::Generator::handle_name_abi_cxx11_
          (string *__return_storage_ptr__,Generator *this,bool ignore_top)

{
  ostream *poVar1;
  pointer pcVar2;
  Generator *this_00;
  Stmt *stmt;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pbVar3;
  int iVar4;
  undefined4 extraout_var;
  ForStmt *this_02;
  InternalException *this_03;
  undefined7 in_register_00000011;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  long lVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  optional<unsigned_long> oVar7;
  string_view format_str;
  format_args args;
  undefined1 local_230 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> label;
  undefined1 auStack_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string local_88;
  undefined4 local_64;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> n;
  undefined4 extraout_var_00;
  
  local_64 = (undefined4)CONCAT71(in_register_00000011,ignore_top);
  n.field_2._8_8_ = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)n.field_2._8_8_;
  pcVar2 = (this->instance_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->instance_name)._M_string_length
            );
  auStack_a8 = (undefined1  [8])0x0;
  values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    if ((this->parent_generator_ == (Generator *)0x0) ||
       (this->instantiation_stmt_ == (ModuleInstantiationStmt *)0x0)) {
LAB_0017061a:
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_emplace_aux<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_a8,
                 (const_iterator)auStack_a8,&this->instance_name);
    }
    else {
      iVar4 = (*(this->instantiation_stmt_->super_Stmt).super_IRNode._vptr_IRNode[4])();
      if (*(int *)(CONCAT44(extraout_var,iVar4) + 0x48) != 2) goto LAB_0017061a;
      iVar4 = (*(this->instantiation_stmt_->super_Stmt).super_IRNode._vptr_IRNode[4])();
      this_02 = (ForStmt *)CONCAT44(extraout_var_00,iVar4);
      this_00 = this->parent_generator_;
      stmt = (Stmt *)(this_02->loop_body_).
                     super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_01 = (this_02->loop_body_).
                super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      get_block_name_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_230,this_00,stmt);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Stmt,void>
                ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)&local_88,
                 (__weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                 &(this->instantiation_stmt_->super_Stmt).
                  super_enable_shared_from_this<kratos::Stmt>);
      oVar7 = ForStmt::genvar_index(this_02,(shared_ptr<kratos::Stmt> *)&local_88);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
      }
      if ((label.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._24_1_ != '\x01') ||
         (((undefined1  [16])
           oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
          (undefined1  [16])0x0)) {
        this_03 = (InternalException *)__cxa_allocate_exception(0x10);
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"Invalid state of genvar instance array","");
        InternalException::InternalException(this_03,&local_88);
        __cxa_throw(this_03,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      local_88._M_dataplus._M_p = (this->instance_name)._M_dataplus._M_p;
      local_88._M_string_length = (this->instance_name)._M_string_length;
      format_str.size_ = 0x4d;
      format_str.data_ = (char *)0x8;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_88;
      local_88.field_2._M_allocated_capacity =
           oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
      fmt::v7::detail::vformat_abi_cxx11_((string *)local_60,(detail *)"{0}[{1}]",format_str,args);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_emplace_aux<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_a8,
                 (const_iterator)auStack_a8,(string *)local_60);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_emplace_aux<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_a8,
                 (const_iterator)auStack_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
      if (local_60 != (undefined1  [8])&n._M_string_length) {
        operator_delete((void *)local_60,n._M_string_length + 1);
      }
      if (label.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._24_1_ == '\x01') {
        label.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_1_ = 0;
        if (local_230 !=
            (undefined1  [8])
            ((long)&label.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload + 8)) {
          operator_delete((void *)local_230,
                          label.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._M_value._M_string_length + 1);
        }
      }
    }
    pbVar3 = values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this = this->parent_generator_;
    if (this == (Generator *)0x0) {
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)auStack_a8 + (ulong)(byte)local_64 * 0x20);
      local_60 = (undefined1  [8])&n._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,".","");
      std::__cxx11::stringstream::stringstream((stringstream *)local_230);
      if (pbVar6 != pbVar3) {
        poVar1 = (ostream *)
                 ((long)&label.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload + 8);
        lVar5 = 0;
        do {
          if (lVar5 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar1,(char *)local_60,(long)n._M_dataplus._M_p);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar1,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
          pbVar6 = pbVar6 + 1;
          lVar5 = lVar5 + -0x20;
        } while (pbVar6 != pbVar3);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_230);
      std::ios_base::~ios_base((ios_base *)&stack0xfffffffffffffe50);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (local_60 != (undefined1  [8])&n._M_string_length) {
        operator_delete((void *)local_60,n._M_string_length + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_a8);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::string Generator::handle_name(bool ignore_top) const {
    // this is used to identify the generator from the top level
    std::string result = instance_name;
    auto const *current = this;
    std::vector<std::string> values;
    while (current != nullptr) {
        // need to check if we are in a gen block
        if (current->parent_generator_ && current->instantiation_stmt_ &&
            current->instantiation_stmt_->parent()->ir_node_kind() == IRNodeKind::StmtKind) {
            // need to find out the label
            // need two parents since the previous parent is a stmt block
            auto *for_ = reinterpret_cast<ForStmt *>(current->instantiation_stmt_->parent());
            auto label = current->parent_generator_->get_block_name(for_->get_loop_body().get());
            // need to find out the index
            auto index = for_->genvar_index(current->instantiation_stmt_->shared_from_this());
            if (!label || !index) {
                throw InternalException("Invalid state of genvar instance array");
            }

            auto n = ::format("{0}[{1}]", current->instance_name, *index);
            values.emplace(values.begin(), n);
            values.emplace(values.begin(), *label);
        } else {
            values.emplace(values.begin(), current->instance_name);
        }

        current = current->parent_generator_;
    }
    auto starting = ignore_top ? 1u : 0u;
    result = string::join(values.begin() + starting, values.end(), ".");

    return result;
}